

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientFeederApplication.h
# Opt level: O2

void __thiscall
ClientFeederApplication::ClientFeederApplication
          (ClientFeederApplication *this,Logger<std::shared_ptr<spdlog::logger>_> *logger,
          AppConfig *configs)

{
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger(&this->m_logger,logger);
  ConfigManager::Configurations::AppConfig::AppConfig(&this->m_configs,configs);
  (this->m_continue)._M_base._M_i = true;
  return;
}

Assistant:

ClientFeederApplication(LogManager::Logger<std::shared_ptr<spdlog::logger>>& logger,
                            ConfigManager::Configurations::AppConfig& configs) :
        m_logger(logger),
        m_configs(configs),
        m_continue(true)
    {}